

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall
Lowerer::LowerBinaryHelperMemWithTemp3
          (Lowerer *this,Instr *instr,JnHelperMethod helperMethod,
          JnHelperMethod helperMethodWithTemp,JnHelperMethod helperMethodLeftDead)

{
  code *pcVar1;
  bool bVar2;
  RegOpnd *pRVar3;
  undefined4 *puVar4;
  byte local_3b;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_3a;
  Opnd *local_38;
  Opnd *src1;
  JnHelperMethod local_28;
  JnHelperMethod helperMethodLeftDead_local;
  JnHelperMethod helperMethodWithTemp_local;
  JnHelperMethod helperMethod_local;
  Instr *instr_local;
  Lowerer *this_local;
  
  src1._4_4_ = helperMethodLeftDead;
  local_28 = helperMethodWithTemp;
  helperMethodLeftDead_local = helperMethod;
  _helperMethodWithTemp_local = instr;
  instr_local = (Instr *)this;
  local_38 = IR::Instr::GetSrc1(instr);
  bVar2 = IR::Opnd::IsRegOpnd(local_38);
  local_3b = 0;
  if (bVar2) {
    pRVar3 = IR::Opnd::AsRegOpnd(local_38);
    local_3b = 0;
    if ((pRVar3->field_0x18 & 1) != 0) {
      local_3a.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           IR::Opnd::GetValueType(local_38);
      bVar2 = ValueType::IsNotString((ValueType *)&local_3a.field_0);
      local_3b = bVar2 ^ 0xff;
    }
  }
  if ((local_3b & 1) == 0) {
    this_local = (Lowerer *)
                 LowerBinaryHelperMemWithTemp2
                           (this,_helperMethodWithTemp_local,helperMethodLeftDead_local,local_28);
  }
  else {
    if (src1._4_4_ != HelperOp_AddLeftDead) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x2315,"(helperMethodLeftDead == IR::HelperOp_AddLeftDead)",
                         "helperMethodLeftDead == IR::HelperOp_AddLeftDead");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    this_local = (Lowerer *)LowerAddLeftDeadForString(this,_helperMethodWithTemp_local);
  }
  return (Instr *)this_local;
}

Assistant:

IR::Instr *
Lowerer::LowerBinaryHelperMemWithTemp3(IR::Instr *instr, IR::JnHelperMethod helperMethod, IR::JnHelperMethod helperMethodWithTemp, IR::JnHelperMethod helperMethodLeftDead)
{
    IR::Opnd *src1 = instr->GetSrc1();

    if (src1->IsRegOpnd() && src1->AsRegOpnd()->m_isTempLastUse && !src1->GetValueType().IsNotString())
    {
        Assert(helperMethodLeftDead == IR::HelperOp_AddLeftDead);
        return LowerAddLeftDeadForString(instr);
    }
    else
    {
        return this->LowerBinaryHelperMemWithTemp2(instr, helperMethod, helperMethodWithTemp);
    }
}